

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O1

char * fwrite_flag(long flags,char *buf)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  
  pcVar1 = buf;
  *buf = '\0';
  if (flags != 0) {
    uVar2 = 0;
    do {
      if (((ulong)flags >> (uVar2 & 0x3f) & 1) != 0) {
        cVar3 = (char)uVar2 + 'A';
        if (0x19 < uVar2) {
          cVar3 = (char)uVar2 + 'G';
        }
        *buf = cVar3;
        buf = buf + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x20);
    *buf = '\0';
    return pcVar1;
  }
  buf[0] = '0';
  buf[1] = '\0';
  return pcVar1;
}

Assistant:

char *fwrite_flag(long flags, char buf[])
{
	char offset;
	char *cp;

	buf[0] = '\0';

	if (flags == 0)
	{
		strcpy(buf, "0");
		return buf;
	}

	/* 32 -- number of bits in a long */
	for (offset = 0, cp = buf; offset < 32; offset++)
	{
		if (flags & ((long)1 << offset))
		{
			if (offset <= 'Z' - 'A')
				*(cp++) = 'A' + offset;
			else
				*(cp++) = 'a' + offset - ('Z' - 'A' + 1);
		}
	}

	*cp = '\0';
	return buf;
}